

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O1

size_t __thiscall CodegenC::FunctionTable::look_up(FunctionTable *this,Function *function)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  Function *local_10;
  
  p_Var1 = &(this->functions)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < function]) {
    if (*(Function **)(p_Var4 + 1) >= function) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, function < *(Function **)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    p_Var4 = (_Base_ptr)(this->functions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_10 = function;
    pmVar2 = std::
             map<const_Function_*,_unsigned_long,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_unsigned_long>_>_>
             ::operator[](&this->functions,&local_10);
    *pmVar2 = (mapped_type)p_Var4;
  }
  else {
    p_Var4 = p_Var4[1]._M_parent;
  }
  return (size_t)p_Var4;
}

Assistant:

std::size_t look_up(const Function* function) {
			auto iterator = functions.find(function);
			if (iterator != functions.end()) {
				return iterator->second;
			}
			const std::size_t index = functions.size();
			functions[function] = index;
			return index;
		}